

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lj_cconv.c
# Opt level: O1

int lj_cconv_tv_ct(CTState *cts,CType *s,CTypeID sid,TValue *o,uint8_t *sp)

{
  long *plVar1;
  uint uVar2;
  int iVar3;
  GCcdata *pGVar4;
  void *pvVar5;
  bool bVar6;
  
  uVar2 = s->info;
  if (uVar2 < 0x10000000) {
    if (0x7ffffff < uVar2) {
      if (s->size == 1) {
        bVar6 = *sp == '\0';
      }
      else {
        bVar6 = *(int *)sp == 0;
      }
      (o->field_2).it = -(uint)!bVar6 - 2;
      (cts->g->tmptv2).field_2.it = -(uint)!bVar6 - 2;
      return 0;
    }
    if ((0x3ffffff < uVar2) || (s->size < 5)) {
      lj_cconv_ct_ct(cts,cts->tab + 0xe,s,(uint8_t *)&o->u64,sp,0);
      return 0;
    }
  }
  else if ((uVar2 & 0xfc000000) == 0x30000000 || (uVar2 & 0xf0000000) == 0x10000000) {
    pGVar4 = lj_cdata_newref(cts,sp,sid);
    (o->u32).lo = (uint32_t)pGVar4;
    (o->field_2).it = 0xfffffff5;
    return 1;
  }
  uVar2 = s->size;
  iVar3 = *(int *)&cts->tab;
  pvVar5 = lj_mem_newgco(cts->L,uVar2 + 8);
  *(undefined1 *)((long)pvVar5 + 5) = 10;
  *(short *)((long)pvVar5 + 6) = (short)((uint)((int)s - iVar3) >> 4);
  plVar1 = (long *)((ulong)(cts->L->glref).ptr32 + 0xe0);
  *plVar1 = *plVar1 + 1;
  (o->u32).lo = (uint32_t)pvVar5;
  (o->field_2).it = 0xfffffff5;
  memcpy((void *)((long)pvVar5 + 8),sp,(ulong)uVar2);
  return 1;
}

Assistant:

int lj_cconv_tv_ct(CTState *cts, CType *s, CTypeID sid,
		   TValue *o, uint8_t *sp)
{
  CTInfo sinfo = s->info;
  if (ctype_isnum(sinfo)) {
    if (!ctype_isbool(sinfo)) {
      if (ctype_isinteger(sinfo) && s->size > 4) goto copyval;
      if (LJ_DUALNUM && ctype_isinteger(sinfo)) {
	int32_t i;
	lj_cconv_ct_ct(cts, ctype_get(cts, CTID_INT32), s,
		       (uint8_t *)&i, sp, 0);
	if ((sinfo & CTF_UNSIGNED) && i < 0)
	  setnumV(o, (lua_Number)(uint32_t)i);
	else
	  setintV(o, i);
      } else {
	lj_cconv_ct_ct(cts, ctype_get(cts, CTID_DOUBLE), s,
		       (uint8_t *)&o->n, sp, 0);
	/* Numbers are NOT canonicalized here! Beware of uninitialized data. */
	lj_assertCTS(tvisnum(o), "non-canonical NaN passed");
      }
    } else {
      uint32_t b = s->size == 1 ? (*sp != 0) : (*(int *)sp != 0);
      setboolV(o, b);
      setboolV(&cts->g->tmptv2, b);  /* Remember for trace recorder. */
    }
    return 0;
  } else if (ctype_isrefarray(sinfo) || ctype_isstruct(sinfo)) {
    /* Create reference. */
    setcdataV(cts->L, o, lj_cdata_newref(cts, sp, sid));
    return 1;  /* Need GC step. */
  } else {
    GCcdata *cd;
    CTSize sz;
  copyval:  /* Copy value. */
    sz = s->size;
    lj_assertCTS(sz != CTSIZE_INVALID, "value copy with invalid size");
    /* Attributes are stripped, qualifiers are kept (but mostly ignored). */
    cd = lj_cdata_new(cts, ctype_typeid(cts, s), sz);
    setcdataV(cts->L, o, cd);
    memcpy(cdataptr(cd), sp, sz);
    return 1;  /* Need GC step. */
  }
}